

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::AtomicCounterCase::iterate(AtomicCounterCase *this)

{
  deUint32 *this_00;
  uint uVar1;
  RenderContext *renderCtx;
  int iVar2;
  ContextType type;
  GLSLVersion version;
  GLuint GVar3;
  deUint32 dVar4;
  GLenum GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ostream *poVar8;
  ProgramSources *sources;
  TestError *pTVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  allocator<char> local_4c5;
  int local_4c4;
  BufferMemMap bufMap;
  string local_498;
  Buffer counterBuffer;
  Buffer outputBuffer;
  BufferMemMap bufMap_1;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  ShaderProgram program;
  BufferMemMap memMap;
  uint local_2ec;
  int local_2e8;
  ostringstream src;
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&counterBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  uVar11 = (this->m_localSize).m_data[1] * (this->m_localSize).m_data[0] *
           (this->m_localSize).m_data[2] * (this->m_workSize).m_data[0] *
           (this->m_workSize).m_data[1] * (this->m_workSize).m_data[2];
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar7 = glu::getGLSLVersionDeclaration(version);
  poVar8 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"layout (local_size_x = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[0]);
  poVar8 = std::operator<<(poVar8,", local_size_y = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[1]);
  poVar8 = std::operator<<(poVar8,", local_size_z = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[2]);
  poVar8 = std::operator<<(poVar8,") in;\n");
  poVar8 = std::operator<<(poVar8,"layout(binding = 0) buffer Output {\n");
  poVar8 = std::operator<<(poVar8,"    uint values[");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar11);
  poVar8 = std::operator<<(poVar8,"];\n");
  poVar8 = std::operator<<(poVar8,"} sb_out;\n\n");
  poVar8 = std::operator<<(poVar8,"layout(binding = 0, offset = 0) uniform atomic_uint u_count;\n\n"
                          );
  poVar8 = std::operator<<(poVar8,"void main (void) {\n");
  poVar8 = std::operator<<(poVar8,
                           "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar8 = std::operator<<(poVar8,
                           "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar8 = std::operator<<(poVar8,"    uint globalOffs = localSize*globalNdx;\n");
  poVar8 = std::operator<<(poVar8,
                           "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
                          );
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"    uint oldVal = atomicCounterIncrement(u_count);\n");
  poVar8 = std::operator<<(poVar8,"    sb_out.values[globalOffs+localOffs] = oldVal;\n");
  std::operator<<(poVar8,"}\n");
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&memMap,0,0xac);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&bufMap,&local_498);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&memMap,(ShaderSource *)&bufMap);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)&bufMap.m_target);
  std::__cxx11::string::~string((string *)&local_498);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&memMap);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x5f2);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  memMap.m_gl = (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  this_00 = &memMap.m_target;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Work groups: ");
  tcu::operator<<((ostream *)this_00,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&memMap,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  (*gl->useProgram)(program.m_program.m_program);
  GVar3 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e1,"u_count");
  dVar4 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e1,GVar3,0x9301);
  dVar4 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92c0,dVar4,0x9303);
  (*gl->bindBuffer)(0x92c0,counterBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x92c0,(ulong)dVar4,(void *)0x0,0x88e1);
  BufferMemMap::BufferMemMap(&memMap,gl,0x92c0,0,dVar4,2);
  memset(memMap.m_ptr,0,(long)(int)dVar4);
  BufferMemMap::~BufferMemMap(&memMap);
  (*gl->bindBufferBase)(0x92c0,0,counterBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Atomic counter buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x607);
  GVar3 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar3,0x9303);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar4,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,0,outputBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x612);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x617);
  GVar3 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e1,"u_count");
  dVar4 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e1,GVar3,0x92fc);
  dVar6 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e1,GVar3,0x9301);
  dVar6 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92c0,dVar6,0x9303);
  BufferMemMap::BufferMemMap(&bufMap,gl,0x92c0,0,dVar6,1);
  if (*(uint *)((long)bufMap.m_ptr + (ulong)dVar4) == uVar11) {
    BufferMemMap::~BufferMemMap(&bufMap);
    GVar3 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
    dVar4 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar3,0x9303);
    GVar3 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Output.values");
    glu::getProgramInterfaceVariableInfo
              ((InterfaceVariableInfo *)&memMap,gl,program.m_program.m_program,0x92e5,GVar3);
    iVar2 = 0;
    BufferMemMap::BufferMemMap(&bufMap_1,gl,0x90d2,0,dVar4,1);
    uVar10 = 0;
    if (0 < (int)uVar11) {
      uVar10 = (ulong)uVar11;
    }
    uVar13 = 0;
    iVar12 = 0;
    iVar14 = 0;
    while( true ) {
      local_4c4 = (int)uVar13;
      if (uVar10 == uVar13) {
        if (iVar12 == iVar14) {
          BufferMemMap::~BufferMemMap(&bufMap_1);
          std::__cxx11::string::~string((string *)&memMap);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          glu::ShaderProgram::~ShaderProgram(&program);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
          glu::ObjectWrapper::~ObjectWrapper(&counterBuffer.super_ObjectWrapper);
          glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
          return STOP;
        }
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bufMap,"Total sum of values in Output.values doesn\'t match",
                   (allocator<char> *)&local_498);
        tcu::TestError::TestError(pTVar9,(string *)&bufMap);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar1 = *(uint *)((long)bufMap_1.m_ptr + (long)iVar2 + (ulong)local_2ec);
      if (uVar11 <= uVar1) break;
      iVar14 = iVar14 + local_4c4;
      iVar12 = iVar12 + uVar1;
      uVar13 = uVar13 + 1;
      iVar2 = iVar2 + local_2e8;
    }
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"Comparison failed for Output.values[",&local_4c5);
    de::toString<int>(&local_430,&local_4c4);
    std::operator+(&local_498,&local_410,&local_430);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufMap,
                   &local_498,"]");
    tcu::TestError::TestError(pTVar9,(string *)&bufMap);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&memMap,"Invalid atomic counter value",(allocator<char> *)&local_498);
  tcu::TestError::TestError(pTVar9,(string *)&memMap);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const Buffer				counterBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "layout(binding = 0, offset = 0) uniform atomic_uint u_count;\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
			<< "\n"
			<< "    uint oldVal = atomicCounterIncrement(u_count);\n"
			<< "    sb_out.values[globalOffs+localOffs] = oldVal;\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Atomic counter buffer setup
		{
			const deUint32	uniformIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_count");
			const deUint32	bufferIndex		= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_ATOMIC_COUNTER_BUFFER_INDEX);
			const deUint32	bufferSize		= getProgramResourceUint(gl, program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, *counterBuffer);
			gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, bufferSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap memMap(gl, GL_ATOMIC_COUNTER_BUFFER, 0, bufferSize, GL_MAP_WRITE_BIT);
				deMemset(memMap.getPtr(), 0, (int)bufferSize);
			}

			gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, *counterBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Atomic counter buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare atomic counter
		{
			const deUint32		uniformIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_count");
			const deUint32		uniformOffset	= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_OFFSET);
			const deUint32		bufferIndex		= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_ATOMIC_COUNTER_BUFFER_INDEX);
			const deUint32		bufferSize		= getProgramResourceUint(gl, program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferIndex, GL_BUFFER_DATA_SIZE);
			const BufferMemMap	bufMap			(gl, GL_ATOMIC_COUNTER_BUFFER, 0, bufferSize, GL_MAP_READ_BIT);

			const deUint32		resVal			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + uniformOffset));

			if (resVal != (deUint32)numValues)
				throw tcu::TestError("Invalid atomic counter value");
		}

		// Read back and compare SSBO
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);
			deUint32					valSum		= 0;
			deUint32					refSum		= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint32 res = *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*valNdx));

				valSum += res;
				refSum += (deUint32)valNdx;

				if (!de::inBounds<deUint32>(res, 0, (deUint32)numValues))
					throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(valNdx) + "]");
			}

			if (valSum != refSum)
				throw tcu::TestError("Total sum of values in Output.values doesn't match");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}